

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int doctest::detail::fileOrderComparator(void *a,void *b)

{
  long lVar1;
  long lVar2;
  int res;
  TestData *rhs;
  TestData *lhs;
  void *b_local;
  void *a_local;
  
  lVar1 = *a;
  lVar2 = *b;
  a_local._4_4_ = strcmp(*(char **)(lVar1 + 0x18),*(char **)(lVar2 + 0x18));
  if (a_local._4_4_ == 0) {
    a_local._4_4_ = *(int *)(lVar1 + 0x20) - *(int *)(lVar2 + 0x20);
  }
  return a_local._4_4_;
}

Assistant:

int fileOrderComparator(const void* a, const void* b) {
        const TestData* lhs = *static_cast<TestData* const*>(a);
        const TestData* rhs = *static_cast<TestData* const*>(b);
#ifdef _MSC_VER
        // this is needed because MSVC gives different case for drive letters
        // for __FILE__ when evaluated in a header and a source file
        int res = stricmp(lhs->m_file, rhs->m_file);
#else  // _MSC_VER
        int res = strcmp(lhs->m_file, rhs->m_file);
#endif // _MSC_VER
        if(res != 0)
            return res;
        return static_cast<int>(lhs->m_line - rhs->m_line);
    }